

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<char,_fmt::v5::basic_format_specs<char>_>::int_writer
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this,
          basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *w,
          char value,basic_format_specs<char> *s)

{
  type_conflict1 tVar1;
  bool bVar2;
  char local_31;
  basic_format_specs<char> *s_local;
  char value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *w_local;
  int_writer<char,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  this->writer = w;
  this->spec = s;
  this->abs_value = (int)value;
  this->prefix_size = 0;
  tVar1 = internal::is_negative<char>(value);
  if (tVar1) {
    this->prefix[0] = '-';
    this->prefix_size = this->prefix_size + 1;
    this->abs_value = -this->abs_value;
  }
  else {
    bVar2 = basic_format_specs<char>::flag(this->spec,1);
    if (bVar2) {
      bVar2 = basic_format_specs<char>::flag(this->spec,2);
      local_31 = '+';
      if (!bVar2) {
        local_31 = ' ';
      }
      this->prefix[0] = local_31;
      this->prefix_size = this->prefix_size + 1;
    }
  }
  return;
}

Assistant:

int_writer(basic_writer<Range> &w, Int value, const Spec &s)
      : writer(w), spec(s), abs_value(static_cast<unsigned_type>(value)),
        prefix_size(0) {
      if (internal::is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (spec.flag(SIGN_FLAG)) {
        prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
      }
    }